

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableReload.cpp
# Opt level: O1

bool __thiscall DIS::ExpendableReload::operator==(ExpendableReload *this,ExpendableReload *rhs)

{
  bool bVar1;
  
  bVar1 = EntityType::operator==(&this->_expendable,&rhs->_expendable);
  return (bVar1 && this->_station == rhs->_station) &&
         ((this->_maximumQuantity == rhs->_maximumQuantity &&
          this->_standardQuantity == rhs->_standardQuantity) &&
         (this->_maximumQuantityReloadTime == rhs->_maximumQuantityReloadTime &&
         rhs->_standardQuantityReloadTime == this->_standardQuantityReloadTime));
}

Assistant:

bool ExpendableReload::operator ==(const ExpendableReload& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_expendable == rhs._expendable) ) ivarsEqual = false;
     if( ! (_station == rhs._station) ) ivarsEqual = false;
     if( ! (_standardQuantity == rhs._standardQuantity) ) ivarsEqual = false;
     if( ! (_maximumQuantity == rhs._maximumQuantity) ) ivarsEqual = false;
     if( ! (_standardQuantityReloadTime == rhs._standardQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_maximumQuantityReloadTime == rhs._maximumQuantityReloadTime) ) ivarsEqual = false;

    return ivarsEqual;
 }